

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O3

void __thiscall ElfFile::loadElfHeader(ElfFile *this)

{
  ByteArray *this_00;
  uchar uVar1;
  byte *pbVar2;
  ulong uVar3;
  undefined8 uVar4;
  Elf32_Word EVar5;
  Elf32_Addr EVar6;
  Elf32_Off EVar7;
  Elf32_Half EVar8;
  Endianness endianness;
  
  this_00 = &this->fileData;
  pbVar2 = (this->fileData).data_;
  uVar3 = (this->fileData).size_;
  uVar4 = *(undefined8 *)(pbVar2 + 8);
  *(undefined8 *)(this->fileHeader).e_ident = *(undefined8 *)pbVar2;
  *(undefined8 *)((this->fileHeader).e_ident + 8) = uVar4;
  uVar1 = (this->fileHeader).e_ident[5];
  if (uVar3 < 0x12) {
    (this->fileHeader).e_type = 0xffff;
    EVar8 = 0xffff;
  }
  else {
    (this->fileHeader).e_type =
         CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x10],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x11]);
    EVar8 = 0xffff;
    if (0x13 < uVar3) {
      EVar8 = CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x12],
                       pbVar2[(ulong)(uVar1 != '\x02') ^ 0x13]);
    }
  }
  (this->fileHeader).e_machine = EVar8;
  endianness = (Endianness)(uVar1 != '\x02');
  EVar5 = ByteArray::getDoubleWord(this_00,0x14,endianness);
  (this->fileHeader).e_version = EVar5;
  EVar6 = ByteArray::getDoubleWord(this_00,0x18,endianness);
  (this->fileHeader).e_entry = EVar6;
  EVar7 = ByteArray::getDoubleWord(this_00,0x1c,endianness);
  (this->fileHeader).e_phoff = EVar7;
  EVar7 = ByteArray::getDoubleWord(this_00,0x20,endianness);
  (this->fileHeader).e_shoff = EVar7;
  EVar5 = ByteArray::getDoubleWord(this_00,0x24,endianness);
  (this->fileHeader).e_flags = EVar5;
  uVar3 = (this->fileData).size_;
  if (uVar3 < 0x2a) {
    (this->fileHeader).e_ehsize = 0xffff;
LAB_00176522:
    (this->fileHeader).e_phentsize = 0xffff;
LAB_00176528:
    (this->fileHeader).e_phnum = 0xffff;
LAB_0017652e:
    (this->fileHeader).e_shentsize = 0xffff;
  }
  else {
    pbVar2 = (this->fileData).data_;
    (this->fileHeader).e_ehsize =
         CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x28],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x29]);
    if (uVar3 < 0x2c) goto LAB_00176522;
    pbVar2 = (this->fileData).data_;
    (this->fileHeader).e_phentsize =
         CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x2a],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x2b]);
    if (uVar3 < 0x2e) goto LAB_00176528;
    pbVar2 = (this->fileData).data_;
    (this->fileHeader).e_phnum =
         CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x2c],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x2d]);
    if (uVar3 < 0x30) goto LAB_0017652e;
    pbVar2 = (this->fileData).data_;
    (this->fileHeader).e_shentsize =
         CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x2e],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x2f]);
    if (0x31 < uVar3) {
      pbVar2 = (this->fileData).data_;
      (this->fileHeader).e_shnum =
           CONCAT11(pbVar2[(ulong)(uVar1 != '\x02') + 0x30],pbVar2[(ulong)(uVar1 != '\x02') ^ 0x31])
      ;
      EVar8 = 0xffff;
      if (0x33 < uVar3) {
        EVar8 = CONCAT11(this_00->data_[(ulong)(uVar1 != '\x02') + 0x32],
                         this_00->data_[(ulong)(uVar1 != '\x02') ^ 0x33]);
      }
      goto LAB_0017653e;
    }
  }
  (this->fileHeader).e_shnum = 0xffff;
  EVar8 = 0xffff;
LAB_0017653e:
  (this->fileHeader).e_shstrndx = EVar8;
  return;
}

Assistant:

void ElfFile::loadElfHeader()
{
	memcpy(fileHeader.e_ident, &fileData[0], sizeof(fileHeader.e_ident));
	Endianness endianness = getEndianness();
	fileHeader.e_type = fileData.getWord(0x10, endianness);
	fileHeader.e_machine = fileData.getWord(0x12, endianness);
	fileHeader.e_version = fileData.getDoubleWord(0x14, endianness);
	fileHeader.e_entry = fileData.getDoubleWord(0x18, endianness);
	fileHeader.e_phoff = fileData.getDoubleWord(0x1C, endianness);
	fileHeader.e_shoff = fileData.getDoubleWord(0x20, endianness);
	fileHeader.e_flags = fileData.getDoubleWord(0x24, endianness);
	fileHeader.e_ehsize = fileData.getWord(0x28, endianness);
	fileHeader.e_phentsize = fileData.getWord(0x2A, endianness);
	fileHeader.e_phnum = fileData.getWord(0x2C, endianness);
	fileHeader.e_shentsize = fileData.getWord(0x2E, endianness);
	fileHeader.e_shnum = fileData.getWord(0x30, endianness);
	fileHeader.e_shstrndx = fileData.getWord(0x32, endianness);
}